

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O1

DdNode * Cudd_Eval(DdManager *dd,DdNode *f,int *inputs)

{
  uint uVar1;
  uint *puVar2;
  
  uVar1 = (uint)f & 1;
  do {
    puVar2 = (uint *)((ulong)f & 0xfffffffffffffffe);
    while( true ) {
      if (*puVar2 == 0x7fffffff) {
        return (DdNode *)((ulong)uVar1 ^ (ulong)puVar2);
      }
      if (inputs[*puVar2] != 1) break;
      puVar2 = *(uint **)(puVar2 + 4);
    }
    f = *(DdNode **)(puVar2 + 6);
    uVar1 = uVar1 ^ (uint)f & 1;
  } while( true );
}

Assistant:

DdNode *
Cudd_Eval(
  DdManager * dd,
  DdNode * f,
  int * inputs)
{
    int comple;
    DdNode *ptr;

    comple = Cudd_IsComplement(f);
    ptr = Cudd_Regular(f);

    while (!cuddIsConstant(ptr)) {
        if (inputs[ptr->index] == 1) {
            ptr = cuddT(ptr);
        } else {
            comple ^= Cudd_IsComplement(cuddE(ptr));
            ptr = Cudd_Regular(cuddE(ptr));
        }
    }
    return(Cudd_NotCond(ptr,comple));

}